

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_cpp.cpp
# Opt level: O1

string * __thiscall
flatbuffers::cpp::CppGenerator::TablePackSignature_abi_cxx11_
          (string *__return_storage_ptr__,CppGenerator *this,StructDef *struct_def,bool inclass,
          IDLOptions *opts)

{
  long lVar1;
  long *plVar2;
  undefined8 *puVar3;
  int iVar4;
  undefined7 in_register_00000009;
  ulong *puVar5;
  long *plVar6;
  size_type *psVar7;
  char *pcVar8;
  char *pcVar9;
  ulong uVar10;
  undefined8 uVar11;
  ulong *local_298;
  long local_290;
  ulong local_288;
  long lStack_280;
  ulong *local_278;
  long local_270;
  ulong local_268;
  long lStack_260;
  ulong *local_258;
  long local_250;
  ulong local_248;
  undefined4 uStack_240;
  undefined4 uStack_23c;
  ulong *local_238;
  long local_230;
  ulong local_228;
  long lStack_220;
  long *local_218;
  undefined8 local_210;
  long local_208;
  undefined8 uStack_200;
  long *local_1f8;
  undefined8 local_1f0;
  long local_1e8;
  undefined8 uStack_1e0;
  long *local_1d8;
  undefined8 local_1d0;
  long local_1c8;
  undefined8 uStack_1c0;
  long *local_1b8;
  undefined8 local_1b0;
  long local_1a8;
  undefined8 uStack_1a0;
  ulong *local_198;
  long local_190;
  ulong local_188;
  long lStack_180;
  string local_178;
  string local_158;
  string local_138;
  long *local_118;
  long local_110;
  long local_108;
  long lStack_100;
  IDLOptions *local_f8;
  long *local_f0 [2];
  long local_e0 [2];
  long *local_d0;
  long local_c8;
  long local_c0;
  long lStack_b8;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  string local_70;
  string local_50;
  
  iVar4 = (int)CONCAT71(in_register_00000009,inclass);
  pcVar9 = "static ";
  if (iVar4 == 0) {
    pcVar9 = "";
  }
  local_f0[0] = local_e0;
  pcVar8 = pcVar9 + 7;
  if (iVar4 == 0) {
    pcVar8 = pcVar9;
  }
  local_f8 = opts;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f0,pcVar9,pcVar8);
  plVar2 = (long *)std::__cxx11::string::append((char *)local_f0);
  puVar5 = (ulong *)(plVar2 + 2);
  if ((ulong *)*plVar2 == puVar5) {
    local_268 = *puVar5;
    lStack_260 = plVar2[3];
    local_278 = &local_268;
  }
  else {
    local_268 = *puVar5;
    local_278 = (ulong *)*plVar2;
  }
  local_270 = plVar2[1];
  *plVar2 = (long)puVar5;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  EscapeKeyword(&local_138,this,(string *)struct_def);
  uVar10 = 0xf;
  if (local_278 != &local_268) {
    uVar10 = local_268;
  }
  if (uVar10 < local_138._M_string_length + local_270) {
    uVar11 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p != &local_138.field_2) {
      uVar11 = local_138.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar11 < local_138._M_string_length + local_270) goto LAB_001931b8;
    puVar3 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_138,0,(char *)0x0,(ulong)local_278);
  }
  else {
LAB_001931b8:
    puVar3 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_278,(ulong)local_138._M_dataplus._M_p);
  }
  local_218 = &local_208;
  plVar2 = puVar3 + 2;
  if ((long *)*puVar3 == plVar2) {
    local_208 = *plVar2;
    uStack_200 = puVar3[3];
  }
  else {
    local_208 = *plVar2;
    local_218 = (long *)*puVar3;
  }
  local_210 = puVar3[1];
  *puVar3 = plVar2;
  puVar3[1] = 0;
  *(undefined1 *)plVar2 = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_218);
  puVar5 = (ulong *)(plVar2 + 2);
  if ((ulong *)*plVar2 == puVar5) {
    local_248 = *puVar5;
    uStack_240 = (undefined4)plVar2[3];
    uStack_23c = *(undefined4 *)((long)plVar2 + 0x1c);
    local_258 = &local_248;
  }
  else {
    local_248 = *puVar5;
    local_258 = (ulong *)*plVar2;
  }
  local_250 = plVar2[1];
  *plVar2 = (long)puVar5;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  if (inclass) {
    local_298 = &local_288;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"");
  }
  else {
    EscapeKeyword(&local_50,this,(string *)struct_def);
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_298 = &local_288;
    puVar5 = (ulong *)(plVar2 + 2);
    if ((ulong *)*plVar2 == puVar5) {
      local_288 = *puVar5;
      lStack_280 = plVar2[3];
    }
    else {
      local_288 = *puVar5;
      local_298 = (ulong *)*plVar2;
    }
    local_290 = plVar2[1];
    *plVar2 = (long)puVar5;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
  }
  uVar10 = 0xf;
  if (local_258 != &local_248) {
    uVar10 = local_248;
  }
  if (uVar10 < (ulong)(local_290 + local_250)) {
    uVar10 = 0xf;
    if (local_298 != &local_288) {
      uVar10 = local_288;
    }
    if (uVar10 < (ulong)(local_290 + local_250)) goto LAB_00193359;
    puVar3 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_298,0,(char *)0x0,(ulong)local_258);
  }
  else {
LAB_00193359:
    puVar3 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_258,(ulong)local_298);
  }
  local_1f8 = &local_1e8;
  plVar2 = puVar3 + 2;
  if ((long *)*puVar3 == plVar2) {
    local_1e8 = *plVar2;
    uStack_1e0 = puVar3[3];
  }
  else {
    local_1e8 = *plVar2;
    local_1f8 = (long *)*puVar3;
  }
  local_1f0 = puVar3[1];
  *puVar3 = plVar2;
  puVar3[1] = 0;
  *(undefined1 *)plVar2 = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_1f8);
  puVar5 = (ulong *)(plVar2 + 2);
  if ((ulong *)*plVar2 == puVar5) {
    local_228 = *puVar5;
    lStack_220 = plVar2[3];
    local_238 = &local_228;
  }
  else {
    local_228 = *puVar5;
    local_238 = (ulong *)*plVar2;
  }
  local_230 = plVar2[1];
  *plVar2 = (long)puVar5;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  GetBuilder_abi_cxx11_(&local_158,this);
  uVar10 = 0xf;
  if (local_238 != &local_228) {
    uVar10 = local_228;
  }
  if (uVar10 < local_158._M_string_length + local_230) {
    uVar11 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != &local_158.field_2) {
      uVar11 = local_158.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar11 < local_158._M_string_length + local_230) goto LAB_0019347e;
    puVar3 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_158,0,(char *)0x0,(ulong)local_238);
  }
  else {
LAB_0019347e:
    puVar3 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_238,(ulong)local_158._M_dataplus._M_p);
  }
  local_1d8 = &local_1c8;
  plVar2 = puVar3 + 2;
  if ((long *)*puVar3 == plVar2) {
    local_1c8 = *plVar2;
    uStack_1c0 = puVar3[3];
  }
  else {
    local_1c8 = *plVar2;
    local_1d8 = (long *)*puVar3;
  }
  local_1d0 = puVar3[1];
  *puVar3 = plVar2;
  puVar3[1] = 0;
  *(undefined1 *)plVar2 = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_1d8);
  local_118 = &local_108;
  plVar6 = plVar2 + 2;
  if ((long *)*plVar2 == plVar6) {
    local_108 = *plVar6;
    lStack_100 = plVar2[3];
  }
  else {
    local_108 = *plVar6;
    local_118 = (long *)*plVar2;
  }
  local_110 = plVar2[1];
  *plVar2 = (long)plVar6;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_118);
  puVar5 = (ulong *)(plVar2 + 2);
  if ((ulong *)*plVar2 == puVar5) {
    local_188 = *puVar5;
    lStack_180 = plVar2[3];
    local_198 = &local_188;
  }
  else {
    local_188 = *puVar5;
    local_198 = (ulong *)*plVar2;
  }
  local_190 = plVar2[1];
  *plVar2 = (long)puVar5;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  EscapeKeyword(&local_70,this,(string *)struct_def);
  NativeName(&local_178,&local_70,struct_def,local_f8);
  uVar10 = 0xf;
  if (local_198 != &local_188) {
    uVar10 = local_188;
  }
  if (uVar10 < local_178._M_string_length + local_190) {
    uVar11 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_178._M_dataplus._M_p != &local_178.field_2) {
      uVar11 = local_178.field_2._M_allocated_capacity;
    }
    if (local_178._M_string_length + local_190 <= (ulong)uVar11) {
      puVar3 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_178,0,(char *)0x0,(ulong)local_198);
      goto LAB_0019366d;
    }
  }
  puVar3 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_198,(ulong)local_178._M_dataplus._M_p);
LAB_0019366d:
  local_1b8 = &local_1a8;
  plVar2 = puVar3 + 2;
  if ((long *)*puVar3 == plVar2) {
    local_1a8 = *plVar2;
    uStack_1a0 = puVar3[3];
  }
  else {
    local_1a8 = *plVar2;
    local_1b8 = (long *)*puVar3;
  }
  local_1b0 = puVar3[1];
  *puVar3 = plVar2;
  puVar3[1] = 0;
  *(undefined1 *)plVar2 = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_1b8);
  plVar6 = plVar2 + 2;
  if ((long *)*plVar2 == plVar6) {
    local_c0 = *plVar6;
    lStack_b8 = plVar2[3];
    local_d0 = &local_c0;
  }
  else {
    local_c0 = *plVar6;
    local_d0 = (long *)*plVar2;
  }
  local_c8 = plVar2[1];
  *plVar2 = (long)plVar6;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_d0);
  plVar6 = plVar2 + 2;
  if ((long *)*plVar2 == plVar6) {
    local_a0 = *plVar6;
    lStack_98 = plVar2[3];
    local_b0 = &local_a0;
  }
  else {
    local_a0 = *plVar6;
    local_b0 = (long *)*plVar2;
  }
  local_a8 = plVar2[1];
  *plVar2 = (long)plVar6;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_b0);
  plVar6 = plVar2 + 2;
  if ((long *)*plVar2 == plVar6) {
    local_80 = *plVar6;
    lStack_78 = plVar2[3];
    local_90 = &local_80;
  }
  else {
    local_80 = *plVar6;
    local_90 = (long *)*plVar2;
  }
  local_88 = plVar2[1];
  *plVar2 = (long)plVar6;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_90);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar7 = (size_type *)(plVar2 + 2);
  if ((size_type *)*plVar2 == psVar7) {
    lVar1 = plVar2[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar7;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar1;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar2;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar7;
  }
  __return_storage_ptr__->_M_string_length = plVar2[1];
  *plVar2 = (long)psVar7;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  if (local_90 != &local_80) {
    operator_delete(local_90,local_80 + 1);
  }
  if (local_b0 != &local_a0) {
    operator_delete(local_b0,local_a0 + 1);
  }
  if (local_d0 != &local_c0) {
    operator_delete(local_d0,local_c0 + 1);
  }
  if (local_1b8 != &local_1a8) {
    operator_delete(local_1b8,local_1a8 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178._M_dataplus._M_p != &local_178.field_2) {
    operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if (local_198 != &local_188) {
    operator_delete(local_198,local_188 + 1);
  }
  if (local_118 != &local_108) {
    operator_delete(local_118,local_108 + 1);
  }
  if (local_1d8 != &local_1c8) {
    operator_delete(local_1d8,local_1c8 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != &local_158.field_2) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  if (local_238 != &local_228) {
    operator_delete(local_238,local_228 + 1);
  }
  if (local_1f8 != &local_1e8) {
    operator_delete(local_1f8,local_1e8 + 1);
  }
  if (local_298 != &local_288) {
    operator_delete(local_298,local_288 + 1);
  }
  if ((!inclass) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2)) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (local_258 != &local_248) {
    operator_delete(local_258,local_248 + 1);
  }
  if (local_218 != &local_208) {
    operator_delete(local_218,local_208 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
  }
  if (local_278 != &local_268) {
    operator_delete(local_278,local_268 + 1);
  }
  if (local_f0[0] != local_e0) {
    operator_delete(local_f0[0],local_e0[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string TablePackSignature(const StructDef &struct_def, bool inclass,
                                 const IDLOptions &opts) {
    return std::string(inclass ? "static " : "") + "::flatbuffers::Offset<" +
           Name(struct_def) + "> " + (inclass ? "" : Name(struct_def) + "::") +
           "Pack(" + GetBuilder() + " &_fbb, " + "const " +
           NativeName(Name(struct_def), &struct_def, opts) + "* _o, " +
           "const ::flatbuffers::rehasher_function_t *_rehasher" +
           (inclass ? " = nullptr" : "") + ")";
  }